

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue v_03;
  JSValue obj;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  BOOL in_stack_00000010;
  JSValue splitter;
  JSString *rp;
  JSString *sp;
  int64_t e;
  int64_t r;
  int64_t s;
  int64_t q;
  int64_t p;
  uint32_t lengthA;
  uint32_t lim;
  JSValue T;
  JSValue R;
  JSValue A;
  JSValue S;
  JSValue args [2];
  JSValue limit;
  JSValue separator;
  JSValue O;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  JSContext *in_stack_fffffffffffffe20;
  JSValue in_stack_fffffffffffffe28;
  JSValue in_stack_fffffffffffffe38;
  JSValueUnion JVar8;
  undefined1 in_stack_fffffffffffffe48 [16];
  undefined1 auVar9 [12];
  JSValue in_stack_fffffffffffffe58;
  JSValueUnion JVar10;
  JSValue in_stack_fffffffffffffe68;
  long lVar11;
  int local_100;
  int local_fc;
  int32_t local_98;
  JSAtom prop;
  JSContext *ctx_00;
  JSValueUnion JVar12;
  void *pvVar13;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_10;
  JSValue *local_8;
  
  auVar9 = in_stack_fffffffffffffe48._4_12_;
  JVar12 = (JSValueUnion)in_R8->ptr;
  pvVar13 = in_R8[1].ptr;
  local_98 = in_R8[2].int32;
  prop = SUB84(in_R8[2],4);
  ctx_00 = (JSContext *)in_R8[3].ptr;
  JVar5.tag = in_RDX;
  JVar5.u.ptr = in_RSI.ptr;
  iVar1 = JS_IsUndefined(JVar5);
  if ((iVar1 != 0) ||
     (JVar6.tag = in_RDX, JVar6.u.ptr = in_RSI.ptr, iVar1 = JS_IsNull(JVar6), iVar1 != 0)) {
    JVar5 = JS_ThrowTypeError(in_RDI,"cannot convert to object");
    return JVar5;
  }
  JVar7.tag = (int64_t)pvVar13;
  JVar7.u.ptr = JVar12.ptr;
  iVar1 = JS_IsUndefined(JVar7);
  if ((iVar1 == 0) &&
     (v_02.tag = (int64_t)pvVar13, v_02.u.ptr = JVar12.ptr, iVar1 = JS_IsNull(v_02), iVar1 == 0)) {
    in_stack_fffffffffffffe18 = 0;
    obj.tag = in_RDX;
    obj.u.ptr = in_RSI.ptr;
    this_obj.tag = (int64_t)pvVar13;
    this_obj.u.ptr = JVar12.ptr;
    JVar5 = JS_GetPropertyInternal(ctx_00,obj,prop,this_obj,in_stack_00000010);
    local_10 = JVar5.u;
    local_8 = (JSValue *)JVar5.tag;
    iVar1 = JS_IsException(JVar5);
    if (iVar1 != 0) {
      local_40.ptr = (void *)(local_40 << 0x20);
      local_38 = 6;
      return _local_40;
    }
    v.tag = (int64_t)local_8;
    v.u.ptr = local_10.ptr;
    iVar1 = JS_IsUndefined(v);
    if ((iVar1 == 0) &&
       (v_00.tag = (int64_t)local_8, v_00.u.ptr = local_10.ptr, iVar1 = JS_IsNull(v_00), iVar1 == 0)
       ) {
      JVar5 = JS_CallFree(auVar9._4_8_,in_stack_fffffffffffffe68,in_stack_fffffffffffffe58,
                          auVar9._0_4_,local_8);
      return JVar5;
    }
  }
  val.u._4_4_ = in_stack_fffffffffffffe1c;
  val.u.int32 = in_stack_fffffffffffffe18;
  val.tag = (int64_t)in_stack_fffffffffffffe20;
  JVar5 = JS_ToString((JSContext *)0x1b8d86,val);
  JVar10 = JVar5.u;
  iVar1 = JS_IsException(JVar5);
  if (iVar1 == 0) {
    JVar6 = JS_NewArray(in_stack_fffffffffffffe20);
    JVar5 = JVar6;
    iVar1 = JS_IsException(JVar6);
    if (iVar1 == 0) {
      local_100 = 0;
      v_01.u._4_4_ = prop;
      v_01.u.int32 = local_98;
      v_01.tag = (int64_t)ctx_00;
      iVar1 = JS_IsUndefined(v_01);
      if (iVar1 == 0) {
        iVar1 = JS_ToUint32(in_stack_fffffffffffffe20,
                            (uint32_t *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe28);
        if (iVar1 < 0) goto LAB_001b925f;
      }
      else {
        local_fc = -1;
      }
      uVar3 = (ulong)((uint)*(undefined8 *)((long)JVar10.ptr + 4) & 0x7fffffff);
      val_00.u._4_4_ = in_stack_fffffffffffffe1c;
      val_00.u.int32 = in_stack_fffffffffffffe18;
      val_00.tag = (int64_t)in_stack_fffffffffffffe20;
      JVar7 = JS_ToString((JSContext *)0x1b8ec5,val_00);
      JVar8 = JVar7.u;
      iVar1 = JS_IsException(JVar7);
      if (iVar1 == 0) {
        uVar4 = (ulong)((uint)*(undefined8 *)((long)JVar8.ptr + 4) & 0x7fffffff);
        lVar11 = 0;
        if (local_fc != 0) {
          v_03.tag = (int64_t)pvVar13;
          v_03.u.float64 = JVar12.float64;
          iVar1 = JS_IsUndefined(v_03);
          iVar2 = JVar10.int32;
          if (iVar1 == 0) {
            if (uVar3 == 0) {
              if (uVar4 == 0) goto LAB_001b9203;
            }
            else {
              while (iVar2 = JVar10.int32,
                    (int)(uint)((uVar4 != 0 ^ 0xffU) & 1) + lVar11 <=
                    (long)((uVar3 - uVar4) - (long)(int)(uint)((uVar4 != 0 ^ 0xffU) & 1))) {
                iVar1 = string_indexof((JSString *)in_stack_fffffffffffffe38.u.ptr,
                                       (JSString *)in_stack_fffffffffffffe28.tag,
                                       in_stack_fffffffffffffe28.u._4_4_);
                iVar2 = JVar10.int32;
                if ((long)iVar1 < 0) break;
                in_stack_fffffffffffffe38 =
                     js_sub_string((JSContext *)JVar7.tag,(JSString *)JVar7.u.ptr,
                                   in_stack_fffffffffffffe38.tag._4_4_,
                                   (int)in_stack_fffffffffffffe38.tag);
                iVar2 = JS_IsException(in_stack_fffffffffffffe38);
                if (iVar2 != 0) goto LAB_001b925f;
                local_100 = local_100 + 1;
                iVar2 = JS_CreateDataPropertyUint32
                                  ((JSContext *)in_stack_fffffffffffffe38.tag,JVar5,
                                   (int64_t)in_stack_fffffffffffffe38.u,JVar7,JVar10.int32);
                if (iVar2 < 0) goto LAB_001b925f;
                if (local_100 == local_fc) goto LAB_001b9203;
                lVar11 = (long)iVar1 + uVar4;
              }
            }
          }
          in_stack_fffffffffffffe28 =
               js_sub_string((JSContext *)JVar7.tag,(JSString *)JVar7.u.ptr,
                             in_stack_fffffffffffffe38.tag._4_4_,(int)in_stack_fffffffffffffe38.tag)
          ;
          iVar1 = JS_IsException(in_stack_fffffffffffffe28);
          if ((iVar1 != 0) ||
             (iVar1 = JS_CreateDataPropertyUint32
                                ((JSContext *)in_stack_fffffffffffffe38.tag,JVar5,
                                 (int64_t)in_stack_fffffffffffffe38.u,JVar7,iVar2), iVar1 < 0))
          goto LAB_001b925f;
        }
LAB_001b9203:
        JS_FreeValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
        JS_FreeValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
        return JVar6;
      }
    }
  }
LAB_001b925f:
  JS_FreeValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
  JS_FreeValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
  JS_FreeValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
  local_40.ptr = (void *)(local_40 << 0x20);
  local_38 = 6;
  return _local_40;
}

Assistant:

static JSValue js_string_split(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    // split(sep, limit)
    JSValueConst O = this_val, separator = argv[0], limit = argv[1];
    JSValueConst args[2];
    JSValue S, A, R, T;
    uint32_t lim, lengthA;
    int64_t p, q, s, r, e;
    JSString *sp, *rp;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    S = JS_UNDEFINED;
    A = JS_UNDEFINED;
    R = JS_UNDEFINED;

    if (!JS_IsUndefined(separator) && !JS_IsNull(separator)) {
        JSValue splitter;
        splitter = JS_GetProperty(ctx, separator, JS_ATOM_Symbol_split);
        if (JS_IsException(splitter))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(splitter) && !JS_IsNull(splitter)) {
            args[0] = O;
            args[1] = limit;
            return JS_CallFree(ctx, splitter, separator, 2, args);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(limit)) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, limit) < 0)
            goto exception;
    }
    sp = JS_VALUE_GET_STRING(S);
    s = sp->len;
    R = JS_ToString(ctx, separator);
    if (JS_IsException(R))
        goto exception;
    rp = JS_VALUE_GET_STRING(R);
    r = rp->len;
    p = 0;
    if (lim == 0)
        goto done;
    if (JS_IsUndefined(separator))
        goto add_tail;
    if (s == 0) {
        if (r != 0)
            goto add_tail;
        goto done;
    }
    q = p;
    for (q = p; (q += !r) <= s - r - !r; q = p = e + r) {
        e = string_indexof(sp, rp, q);
        if (e < 0)
            break;
        T = js_sub_string(ctx, sp, p, e);
        if (JS_IsException(T))
            goto exception;
        if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T, 0) < 0)
            goto exception;
        if (lengthA == lim)
            goto done;
    }
add_tail:
    T = js_sub_string(ctx, sp, p, s);
    if (JS_IsException(T))
        goto exception;
    if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T,0 ) < 0)
        goto exception;
done:
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return JS_EXCEPTION;
}